

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O3

bool tinyusdz::usda::anon_unknown_1::ConstructPrimTreeRec
               (size_t primIdx,
               vector<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
               *prim_nodes,Prim *destPrim,string *err)

{
  pointer pPVar1;
  _Base_ptr p_Var2;
  size_t sVar3;
  _Link_type p_Var4;
  size_t *psVar5;
  size_t sVar6;
  pointer plVar7;
  pointer plVar8;
  Prim *pPVar9;
  bool bVar10;
  ulong uVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  char *pcVar14;
  _Link_type p_Var15;
  char *pcVar16;
  _Link_type p_Var17;
  _Link_type p_Var18;
  _Base_ptr p_Var19;
  size_t *psVar20;
  int64_t vidx;
  VariantSet variantSet;
  set<long,_std::less<long>,_std::allocator<long>_> variantChildrenIndices;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  variantSets;
  Variant variant;
  Prim prim;
  Prim variantChildPrim;
  ulong local_c28;
  string local_c20;
  undefined1 local_c00 [40];
  _Rb_tree_node_base local_bd8;
  size_t local_bb8;
  Prim *local_bb0;
  pointer local_ba8;
  _Base_ptr local_ba0;
  _Base_ptr local_b98;
  _Base_ptr local_b90;
  _Base_ptr local_b88;
  _Base_ptr local_b80;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_b78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  local_b48;
  undefined1 local_b18 [8];
  undefined1 auStack_b10 [24];
  _Alloc_hider local_af8;
  undefined5 uStack_af0;
  undefined3 local_aeb;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_ae8;
  _Alloc_hider local_ad8;
  size_type local_ad0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ac8;
  bool local_ab8;
  undefined1 local_ab0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a88;
  undefined1 local_a78 [48];
  bool local_a48;
  undefined1 local_a40 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a18;
  undefined1 local_a08 [48];
  undefined1 local_9d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_9b8;
  undefined1 local_9a8 [48];
  optional<bool> local_978;
  bool local_970;
  undefined1 local_968 [48];
  bool local_938;
  undefined1 local_930 [32];
  bool local_910;
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
  local_908;
  undefined1 local_8e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_8c8;
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_8b8;
  undefined1 local_898 [24];
  storage_union local_880 [2];
  bool local_860;
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
  local_858;
  bool local_838;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_830;
  bool local_810;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_808;
  _Rb_tree_node_base local_7e0;
  size_t local_7c0;
  _Rb_tree_node_base local_7b0;
  size_t local_790;
  pointer pTStack_788;
  pointer local_780;
  pointer pTStack_778;
  pointer pTStack_770;
  undefined1 uStack_768;
  undefined7 local_767;
  undefined1 uStack_760;
  undefined8 uStack_75f;
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
  local_750;
  bool local_730;
  undefined1 auStack_728 [32];
  storage_t<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> local_708;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> vStack_6f0;
  undefined1 local_6d0 [656];
  Specifier local_440;
  any aStack_438;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> local_420;
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mStack_408;
  bool local_3d8;
  bool bStack_3d7;
  pointer local_3d0;
  pointer plStack_3c8;
  pointer local_3c0;
  int64_t local_3b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  local_3b0;
  storage_union local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370 [52];
  
  if (destPrim == (Prim *)0x0) {
    if (err == (string *)0x0) {
      return false;
    }
    pcVar16 = (char *)err->_M_string_length;
    pcVar14 = "`destPrim` is nullptr.\n";
  }
  else {
    pPVar1 = (prim_nodes->
             super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar11 = ((long)(prim_nodes->
                    super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3) *
             -0x30c30c30c30c30c3;
    if (primIdx <= uVar11 && uVar11 - primIdx != 0) {
      local_ba8 = pPVar1 + primIdx;
      local_bb0 = destPrim;
      Prim::Prim((Prim *)local_6d0,&local_ba8->prim);
      ::std::__cxx11::string::_M_assign((string *)(local_6d0 + 0x270));
      local_b78._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_b78._M_impl.super__Rb_tree_header._M_header;
      local_b78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_b78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_b78._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_b48._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_b48._M_impl.super__Rb_tree_header._M_header;
      local_b48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_b48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_b48._M_impl.super__Rb_tree_header._M_header._M_right =
           local_b48._M_impl.super__Rb_tree_header._M_header._M_left;
      local_b48._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var13 = *(_Base_ptr *)((long)&pPVar1[primIdx].variantNodeMap._M_t._M_impl + 0x18);
      local_ba0 = (_Base_ptr)((long)&pPVar1[primIdx].variantNodeMap._M_t._M_impl + 8);
      local_b78._M_impl.super__Rb_tree_header._M_header._M_right =
           local_b78._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var13 != local_ba0) {
        do {
          local_c00._0_8_ = local_c00 + 0x10;
          local_c00._8_8_ = 0;
          local_c00[0x10] = '\0';
          local_bd8._M_color = _S_red;
          local_bd8._M_parent = (_Base_ptr)0x0;
          local_bd8._M_left = &local_bd8;
          local_bb8 = 0;
          p_Var12 = p_Var13[2]._M_right;
          local_b90 = (_Base_ptr)&p_Var13[2]._M_parent;
          local_bd8._M_right = local_bd8._M_left;
          local_b80 = p_Var13;
          if (p_Var12 != local_b90) {
            do {
              auStack_b10._0_8_ = auStack_b10._0_8_ & 0xffffffff00000000;
              auStack_b10._8_8_ = (_Link_type)0x0;
              auStack_b10._16_8_ = (_Base_ptr)auStack_b10;
              local_af8._M_p = (pointer)auStack_b10;
              aStack_ae8._8_4_ = 0;
              aStack_ae8._M_allocated_capacity._0_5_ = 0;
              uStack_af0 = 0;
              local_aeb = 0;
              local_ad8._M_p = (pointer)&local_ac8;
              local_ad0 = 0;
              local_ac8._M_local_buf[0] = '\0';
              local_ab8 = false;
              local_970 = false;
              local_808._16_8_ = 0;
              local_808._24_8_ = 0;
              local_808.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_808._8_8_ = 0;
              local_7e0._M_color = _S_red;
              local_7e0._M_parent = (_Base_ptr)0x0;
              aStack_a88._M_local_buf[8] = false;
              local_ab0._32_8_ = 0;
              aStack_a88._M_allocated_capacity = 0;
              local_ab0._16_8_ = 0;
              local_ab0._24_8_ = 0;
              local_ab0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_ab0._8_8_ = 0;
              local_a48 = false;
              local_a78._32_8_ = 0;
              local_a78._40_8_ = 0;
              local_a78._16_8_ = 0;
              local_a78._24_8_ = 0;
              local_a78._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_a78._8_8_ = 0;
              aStack_a18._M_local_buf[8] = false;
              local_a40._32_8_ = 0;
              aStack_a18._M_allocated_capacity = 0;
              local_a40._16_8_ = 0;
              local_a40._24_8_ = 0;
              local_a40._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_a40._8_8_ = 0;
              local_9d8[0] = false;
              local_a08._32_8_ = 0;
              local_a08._40_8_ = 0;
              local_a08._16_8_ = 0;
              local_a08._24_8_ = 0;
              local_a08._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_a08._8_8_ = 0;
              aStack_9b8._M_local_buf[8] = false;
              local_9d8._24_8_ = 0;
              aStack_9b8._M_allocated_capacity = 0;
              local_9d8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_9d8._16_8_ = 0;
              local_9a8._32_8_ = 0;
              local_9a8._40_8_ = 0;
              local_9a8._16_8_ = 0;
              local_9a8._24_8_ = 0;
              local_9a8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_9a8._8_8_ = 0;
              local_978.has_value_ = false;
              local_978.contained = (storage_t<bool>)0x0;
              local_938 = false;
              local_968._32_8_ = 0;
              local_968._40_8_ = 0;
              local_968._16_8_ = 0;
              local_968._24_8_ = 0;
              local_968._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_968._8_8_ = 0;
              local_910 = false;
              local_930._16_8_ = 0;
              local_930._24_8_ = 0;
              local_930._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_930._8_8_ = 0;
              local_8e8[0] = false;
              local_908._16_8_ = 0;
              local_908._24_8_ = 0;
              local_908.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_908._8_8_ = 0;
              aStack_8c8._M_local_buf[8] = false;
              local_8e8._24_8_ = 0;
              aStack_8c8._M_allocated_capacity = 0;
              local_8e8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_8e8._16_8_ = 0;
              local_898[0] = false;
              local_8b8._16_8_ = 0;
              local_8b8._24_8_ = 0;
              local_8b8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_8b8._8_8_ = 0;
              local_860 = false;
              local_880[1]._0_8_ = 0;
              local_880[1]._8_8_ = 0;
              local_880[0].dynamic = (void *)0x0;
              local_880[0]._8_8_ = 0;
              local_898._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_898._16_8_ = 0;
              local_838 = false;
              local_858._16_8_ = 0;
              local_858._24_8_ = 0;
              local_858.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_858._8_8_ = 0;
              local_810 = false;
              local_830._16_8_ = 0;
              local_830._24_8_ = 0;
              local_830.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_830._8_8_ = 0;
              local_7e0._M_left = &local_7e0;
              local_7e0._M_right = &local_7e0;
              local_7c0 = 0;
              local_7b0._M_color = _S_red;
              local_7b0._M_parent = (_Base_ptr)0x0;
              local_7b0._M_left = &local_7b0;
              local_7b0._M_right = &local_7b0;
              uStack_760 = 0;
              uStack_75f = 0;
              pTStack_770 = (pointer)0x0;
              uStack_768 = 0;
              local_767 = 0;
              local_780 = (pointer)0x0;
              pTStack_778 = (pointer)0x0;
              local_790 = 0;
              pTStack_788 = (pointer)0x0;
              local_730 = false;
              local_750._16_8_ = 0;
              local_750._24_8_ = 0;
              local_750.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_750._8_8_ = 0;
              auStack_728[0x10] = 0;
              auStack_728._17_8_ = 0;
              auStack_728._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_728[8] = 0;
              auStack_728._9_7_ = 0;
              vStack_6f0.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)0x0;
              vStack_6f0.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_708._16_8_ = 0;
              vStack_6f0.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl
              .super__Vector_impl_data._M_start = (pointer)0x0;
              local_708.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_708._8_8_ = 0;
              p_Var2 = p_Var12[0x23]._M_left;
              p_Var19 = p_Var12[0x23]._M_parent;
              for (; local_b88 = p_Var12, p_Var19 != p_Var2;
                  p_Var19 = (_Base_ptr)&p_Var19->_M_parent) {
                local_c28 = *(ulong *)p_Var19;
                if ((_Link_type)local_b78._M_impl.super__Rb_tree_header._M_header._M_parent !=
                    (_Link_type)0x0) {
                  p_Var4 = (_Link_type)local_b78._M_impl.super__Rb_tree_header._M_header._M_parent;
                  p_Var18 = (_Link_type)&local_b78._M_impl.super__Rb_tree_header;
                  do {
                    p_Var17 = p_Var18;
                    p_Var15 = p_Var4;
                    sVar3 = *(size_t *)(p_Var15->_M_storage)._M_storage;
                    p_Var18 = p_Var15;
                    if ((long)sVar3 < (long)local_c28) {
                      p_Var18 = p_Var17;
                    }
                    p_Var4 = *(_Link_type *)
                              (&p_Var15->_M_storage)[(ulong)((long)sVar3 < (long)local_c28) - 2].
                              _M_storage;
                  } while (p_Var4 != (_Link_type)0x0);
                  if ((_Rb_tree_header *)p_Var18 == &local_b78._M_impl.super__Rb_tree_header)
                  goto LAB_0012ce56;
                  if ((long)sVar3 < (long)local_c28) {
                    p_Var15 = p_Var17;
                  }
                  if ((long)local_c28 < (long)*(size_t *)(p_Var15->_M_storage)._M_storage)
                  goto LAB_0012ce56;
                  if (err != (string *)0x0) {
                    local_c20._M_dataplus._M_p = (pointer)&local_c20.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_c20,
                               "variant primIdx {} is referenced multiple times.\n","");
                    fmt::format<long>((string *)&local_380,&local_c20,(long *)&local_c28);
                    ::std::__cxx11::string::operator=((string *)err,(string *)&local_380);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_380.dynamic != local_370) {
                      operator_delete(local_380.dynamic,local_370[0]._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c20._M_dataplus._M_p != &local_c20.field_2) {
                      operator_delete(local_c20._M_dataplus._M_p,
                                      local_c20.field_2._M_allocated_capacity + 1);
                    }
                  }
LAB_0012d0cc:
                  ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::~vector
                            (&vStack_6f0);
                  PrimMetas::~PrimMetas((PrimMetas *)&aStack_ae8);
                  ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                              *)local_b18,(_Link_type)auStack_b10._8_8_);
                  bVar10 = false;
                  goto LAB_0012d0fd;
                }
LAB_0012ce56:
                if (((long)local_c28 < 0) ||
                   ((ulong)(((long)(prim_nodes->
                                   super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(prim_nodes->
                                   super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x30c30c30c30c30c3) < local_c28)) {
                  if (err != (string *)0x0) {
                    ::std::__cxx11::string::_M_replace
                              ((ulong)err,0,(char *)err->_M_string_length,0x39546d);
                  }
                  goto LAB_0012d0cc;
                }
                local_c20.field_2._M_allocated_capacity =
                     (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
                local_c20._M_dataplus._M_p = (pointer)0x0;
                Prim::Prim((Prim *)&local_380,(Value *)&local_c20);
                if ((undefined8 *)local_c20.field_2._M_allocated_capacity != (undefined8 *)0x0) {
                  (**(code **)(local_c20.field_2._M_allocated_capacity + 0x20))(&local_c20);
                }
                bVar10 = ConstructPrimTreeRec(local_c28,prim_nodes,(Prim *)&local_380,err);
                if (!bVar10) {
                  Prim::~Prim((Prim *)&local_380);
                  goto LAB_0012d0cc;
                }
                ::std::vector<tinyusdz::Prim,std::allocator<tinyusdz::Prim>>::
                emplace_back<tinyusdz::Prim&>
                          ((vector<tinyusdz::Prim,std::allocator<tinyusdz::Prim>> *)&vStack_6f0,
                           (Prim *)&local_380);
                Prim::~Prim((Prim *)&local_380);
                ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                ::_M_insert_unique<long_const&>
                          ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                            *)&local_b78,(long *)&local_c28);
                p_Var12 = local_b88;
              }
              local_b98 = p_Var12 + 1;
              PrimMetas::operator=((PrimMetas *)&aStack_ae8,(PrimMetas *)(p_Var12 + 2));
              ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                           *)local_b18,
                          (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                           *)&p_Var12[0x21]._M_right);
              ::std::__cxx11::string::_M_assign((string *)local_c00);
              ::std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Variant>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Variant>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Variant>>>
              ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::Variant>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Variant>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Variant>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Variant>>>
                          *)(local_c00 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b98,(Variant *)local_b18);
              ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::~vector(&vStack_6f0);
              PrimMetas::~PrimMetas((PrimMetas *)&aStack_ae8);
              ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                          *)local_b18,(_Link_type)auStack_b10._8_8_);
              p_Var12 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12);
            } while (p_Var12 != local_b90);
          }
          ::std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>>>
          ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::VariantSet>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>>>
                      *)&local_b48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var13 + 1),(VariantSet *)local_c00);
          bVar10 = true;
LAB_0012d0fd:
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
          ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
                      *)(local_c00 + 0x20),(_Link_type)local_bd8._M_parent);
          if ((undefined1 *)local_c00._0_8_ != local_c00 + 0x10) {
            operator_delete((void *)local_c00._0_8_,CONCAT71(local_c00._17_7_,local_c00[0x10]) + 1);
          }
          if (!bVar10) goto LAB_0012d407;
          p_Var13 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)local_b80);
        } while (p_Var13 != local_ba0);
      }
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
      ::operator=(&local_3b0,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                   *)&local_b48);
      psVar20 = (local_ba8->children).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      psVar5 = (local_ba8->children).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (psVar20 != psVar5) {
        do {
          if ((_Link_type)local_b78._M_impl.super__Rb_tree_header._M_header._M_parent ==
              (_Link_type)0x0) {
LAB_0012d1e1:
            local_370[0]._M_allocated_capacity =
                 &linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_380.dynamic =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            Prim::Prim((Prim *)local_b18,(Value *)&local_380);
            if ((undefined8 *)local_370[0]._0_8_ != (undefined8 *)0x0) {
              (**(code **)(local_370[0]._M_allocated_capacity + 0x20))(&local_380);
            }
            bVar10 = ConstructPrimTreeRec(*psVar20,prim_nodes,(Prim *)local_b18,err);
            if (!bVar10) {
              Prim::~Prim((Prim *)local_b18);
LAB_0012d407:
              bVar10 = false;
              goto LAB_0012d409;
            }
            ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::
            emplace_back<tinyusdz::Prim>(&local_420,(Prim *)local_b18);
            Prim::~Prim((Prim *)local_b18);
          }
          else {
            sVar3 = *psVar20;
            p_Var4 = (_Link_type)local_b78._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var18 = (_Link_type)&local_b78._M_impl.super__Rb_tree_header;
            do {
              p_Var17 = p_Var18;
              p_Var15 = p_Var4;
              sVar6 = *(size_t *)(p_Var15->_M_storage)._M_storage;
              p_Var18 = p_Var15;
              if ((long)sVar6 < (long)sVar3) {
                p_Var18 = p_Var17;
              }
              p_Var4 = *(_Link_type *)
                        (&p_Var15->_M_storage)[(ulong)((long)sVar6 < (long)sVar3) - 2]._M_storage;
            } while (p_Var4 != (_Link_type)0x0);
            if ((_Rb_tree_header *)p_Var18 == &local_b78._M_impl.super__Rb_tree_header)
            goto LAB_0012d1e1;
            if ((long)sVar6 < (long)sVar3) {
              p_Var15 = p_Var17;
            }
            if ((long)sVar3 < (long)*(size_t *)(p_Var15->_M_storage)._M_storage) goto LAB_0012d1e1;
          }
          psVar20 = psVar20 + 1;
        } while (psVar20 != psVar5);
      }
      pPVar9 = local_bb0;
      Path::operator=(&local_bb0->_abs_path,(Path *)local_6d0);
      Path::operator=(&pPVar9->_path,(Path *)(local_6d0 + 0xd0));
      Path::operator=(&pPVar9->_elementPath,(Path *)(local_6d0 + 0x1a0));
      ::std::__cxx11::string::operator=
                ((string *)&pPVar9->_prim_type_name,(string *)(local_6d0 + 0x270));
      pPVar9->_specifier = local_440;
      linb::any::operator=(&(pPVar9->_data).v_,&aStack_438);
      auStack_b10._8_8_ =
           (pPVar9->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      (pPVar9->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_420.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_b18 = (undefined1  [8])
                  (pPVar9->_children).
                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                  super__Vector_impl_data._M_start;
      auStack_b10._0_8_ =
           (pPVar9->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (pPVar9->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_420.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
           super__Vector_impl_data._M_start;
      (pPVar9->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_420.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_420.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_420.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_420.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::~vector
                ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)local_b18);
      ::std::
      multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&pPVar9->_childrenNameSet,&mStack_408);
      pPVar9->_child_dirty = local_3d8;
      pPVar9->_primChildrenIndicesIsValid = bStack_3d7;
      plVar7 = (pPVar9->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      plVar8 = (pPVar9->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (pPVar9->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start = local_3d0;
      (pPVar9->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish = plStack_3c8;
      (pPVar9->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_3c0;
      local_3c0 = (pointer)0x0;
      local_3d0 = (pointer)0x0;
      plStack_3c8 = (pointer)0x0;
      if (plVar7 != (pointer)0x0) {
        operator_delete(plVar7,(long)plVar8 - (long)plVar7);
      }
      pPVar9->_prim_id = local_3b8;
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
      ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                   *)&pPVar9->_variantSets,&local_3b0);
      bVar10 = true;
LAB_0012d409:
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
      ::_M_erase(&local_b48,(_Link_type)local_b48._M_impl.super__Rb_tree_header._M_header._M_parent)
      ;
      ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      _M_erase(&local_b78,(_Link_type)local_b78._M_impl.super__Rb_tree_header._M_header._M_parent);
      Prim::~Prim((Prim *)local_6d0);
      return bVar10;
    }
    if (err == (string *)0x0) {
      return false;
    }
    pcVar16 = (char *)err->_M_string_length;
    pcVar14 = "primIndex exceeds prim_nodes.size()\n";
  }
  ::std::__cxx11::string::_M_replace((ulong)err,0,pcVar16,(ulong)pcVar14);
  return false;
}

Assistant:

bool ConstructPrimTreeRec(const size_t primIdx,
                        const std::vector<PrimNode> &prim_nodes,
                        Prim *destPrim,
                        std::string *err) {

  if (!destPrim) {
    if (err) {
      (*err) = "`destPrim` is nullptr.\n";
    }
    return false;
  }

  if (primIdx >= prim_nodes.size()) {
    if (err) {
      (*err) = "primIndex exceeds prim_nodes.size()\n";
    }
    return false;
  }

  const auto &node = prim_nodes[primIdx];

  Prim prim(node.prim);
  prim.prim_type_name() = node.typeName;

  DCOUT("prim[" << primIdx << "].type = " << node.prim.type_name());
  DCOUT("prim[" << primIdx << "].variantNodeMap.size = " << node.variantNodeMap.size());
  //prim.prim_id() = int64_t(idx);

  // Firstly process variants.
  std::set<int64_t> variantChildrenIndices; // record variantChildren indices

  std::map<std::string, VariantSet> variantSets;
  for (const auto &variantNodes : node.variantNodeMap) {
    DCOUT("variantSet " << variantNodes.first);
    VariantSet variantSet;
    for (const auto &item : variantNodes.second) {
      DCOUT("variant " << item.first);
      Variant variant;
      for (const int64_t vidx : item.second.primChildren) {
        if (variantChildrenIndices.count(vidx)) {
          // Duplicated variant childrenIndices
          if (err) {
            (*err) = fmt::format("variant primIdx {} is referenced multiple times.\n", vidx);
          }
          return false;
        } else {
          // Add prim to variants
          if ((vidx >= 0) && (size_t(vidx) <= prim_nodes.size())) {

            Prim variantChildPrim(value::Value(nullptr)); // dummy
            if (!ConstructPrimTreeRec(size_t(vidx), prim_nodes, &variantChildPrim, err)) {
              return false;
            }

            DCOUT(fmt::format("Added prim {} to variantSet {} : variant {}", variantChildPrim.element_name(), variantNodes.first, item.first));
            variant.primChildren().emplace_back(variantChildPrim);
          } else {
            if (err) {
              (*err) = "primIndex exceeds prim_nodes.size()\n";
            }
            return false;
          }

          variantChildrenIndices.insert(vidx);
        }
      }
      variant.metas() = std::move(item.second.metas);
      variant.properties() = std::move(item.second.props);

      variantSet.name = variantNodes.first;
      variantSet.variantSet.emplace(item.first, std::move(variant));
    }
    variantSets.emplace(variantNodes.first, std::move(variantSet));
  }
  prim.variantSets() = std::move(variantSets);

  for (const auto &cidx : node.children) {
    if (variantChildrenIndices.count(int64_t(cidx))) {
      // Prim is processed
      continue;
    }

    Prim childPrim(value::Value(nullptr)); // dummy
    if (!ConstructPrimTreeRec(cidx, prim_nodes, &childPrim, err)) {
      return false;
    }

    prim.children().emplace_back(std::move(childPrim));
  }

  (*destPrim) = std::move(prim);
  return true;
}